

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrtInfo.cpp
# Opt level: O0

void __thiscall pbrt::semantic::PBRTInfo::traverse(PBRTInfo *this,SP *object)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  size_type sVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  PBRTInfo *in_RSI;
  Counter *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::shared_ptr<pbrt::Object>_>,_bool> pVar8;
  pair<std::_Rb_tree_const_iterator<std::shared_ptr<pbrt::Material>_>,_bool> pVar9;
  shared_ptr<pbrt::Instance> inst;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
  *__range2_2;
  SP curves;
  SP disk;
  SP sphere;
  SP mesh_1;
  SP mesh;
  shared_ptr<pbrt::Shape> shape;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_> *__range2_1;
  shared_ptr<pbrt::LightSource> light;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
  *__range2;
  bool firstTime;
  set<std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::shared_ptr<pbrt::Object>_>_>
  *in_stack_fffffffffffffdc8;
  shared_ptr<pbrt::Instance> *in_stack_fffffffffffffdd0;
  set<std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::shared_ptr<pbrt::Object>_>_>
  *in_stack_fffffffffffffdd8;
  Entity *in_stack_fffffffffffffde8;
  ostream *in_stack_fffffffffffffdf0;
  shared_ptr<pbrt::Instance> local_180;
  shared_ptr<pbrt::Instance> *local_170;
  __normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
  local_168;
  vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
  *local_160;
  string local_158 [32];
  __shared_ptr local_138 [16];
  __shared_ptr local_128 [16];
  __shared_ptr local_118 [16];
  __shared_ptr local_108 [16];
  __shared_ptr local_f8 [16];
  _Base_ptr local_e8;
  undefined1 local_e0;
  shared_ptr<pbrt::Shape> *local_c8;
  __normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
  local_c0;
  vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_> *local_b8;
  __shared_ptr local_b0 [16];
  __shared_ptr local_a0 [16];
  __shared_ptr local_90 [32];
  __shared_ptr local_70 [32];
  shared_ptr<pbrt::LightSource> *local_50;
  __normal_iterator<std::shared_ptr<pbrt::LightSource>_*,_std::vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>_>
  local_48;
  vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
  *local_40;
  _Base_ptr local_38;
  undefined1 local_30;
  _Self local_28;
  _Self local_20;
  undefined7 in_stack_ffffffffffffffe8;
  byte bVar10;
  
  local_20._M_node =
       (_Base_ptr)
       std::
       set<std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::shared_ptr<pbrt::Object>_>_>
       ::find(in_stack_fffffffffffffdd8,(key_type *)in_stack_fffffffffffffdd0);
  local_28._M_node =
       (_Base_ptr)
       std::
       set<std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::shared_ptr<pbrt::Object>_>_>
       ::end(in_stack_fffffffffffffdc8);
  bVar1 = std::operator==(&local_20,&local_28);
  pVar8 = std::
          set<std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::shared_ptr<pbrt::Object>_>_>
          ::insert((set<std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::shared_ptr<pbrt::Object>_>_>
                    *)in_stack_fffffffffffffdf0,(value_type *)in_stack_fffffffffffffde8);
  local_38 = (_Base_ptr)pVar8.first._M_node;
  local_30 = pVar8.second;
  Counter::add(in_RDI + 5,(bool)(bVar1 & 1),1);
  bVar10 = bVar1;
  peVar3 = std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x10ef4b);
  sVar4 = std::
          vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
          ::size(&peVar3->lightSources);
  Counter::add(in_RDI + 0xb,(bool)(bVar1 & 1),sVar4);
  peVar3 = std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x10ef80);
  local_40 = &peVar3->lightSources;
  local_48._M_current =
       (shared_ptr<pbrt::LightSource> *)
       std::
       vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
       ::begin((vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
                *)in_stack_fffffffffffffdc8);
  local_50 = (shared_ptr<pbrt::LightSource> *)
             std::
             vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
             ::end((vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
                    *)in_stack_fffffffffffffdc8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::shared_ptr<pbrt::LightSource>_*,_std::vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>_>
                             *)in_stack_fffffffffffffdd0,
                            (__normal_iterator<std::shared_ptr<pbrt::LightSource>_*,_std::vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>_>
                             *)in_stack_fffffffffffffdc8), bVar2) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<pbrt::LightSource>_*,_std::vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>_>
    ::operator*(&local_48);
    std::shared_ptr<pbrt::LightSource>::shared_ptr
              ((shared_ptr<pbrt::LightSource> *)in_stack_fffffffffffffdd0,
               (shared_ptr<pbrt::LightSource> *)in_stack_fffffffffffffdc8);
    std::__shared_ptr_access<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x10f006);
    Entity::as<pbrt::PointLightSource>(in_stack_fffffffffffffde8);
    bVar2 = std::__shared_ptr::operator_cast_to_bool(local_70);
    std::shared_ptr<pbrt::PointLightSource>::~shared_ptr
              ((shared_ptr<pbrt::PointLightSource> *)0x10f036);
    if (bVar2) {
      Counter::add(in_RDI + 0xd,(bool)(bVar10 & 1),1);
    }
    std::__shared_ptr_access<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x10f09b);
    Entity::as<pbrt::SpotLightSource>(in_stack_fffffffffffffde8);
    bVar2 = std::__shared_ptr::operator_cast_to_bool(local_90);
    std::shared_ptr<pbrt::SpotLightSource>::~shared_ptr
              ((shared_ptr<pbrt::SpotLightSource> *)0x10f0cb);
    if (bVar2) {
      Counter::add(in_RDI + 0xc,(bool)(bVar10 & 1),1);
    }
    std::__shared_ptr_access<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x10f10a);
    Entity::as<pbrt::InfiniteLightSource>(in_stack_fffffffffffffde8);
    bVar2 = std::__shared_ptr::operator_cast_to_bool(local_a0);
    std::shared_ptr<pbrt::InfiniteLightSource>::~shared_ptr
              ((shared_ptr<pbrt::InfiniteLightSource> *)0x10f13a);
    if (bVar2) {
      Counter::add(in_RDI + 0xf,(bool)(bVar10 & 1),1);
    }
    std::__shared_ptr_access<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x10f179);
    Entity::as<pbrt::DistantLightSource>(in_stack_fffffffffffffde8);
    bVar2 = std::__shared_ptr::operator_cast_to_bool(local_b0);
    std::shared_ptr<pbrt::DistantLightSource>::~shared_ptr
              ((shared_ptr<pbrt::DistantLightSource> *)0x10f1a9);
    if (bVar2) {
      Counter::add(in_RDI + 0xe,(bool)(bVar10 & 1),1);
    }
    std::shared_ptr<pbrt::LightSource>::~shared_ptr((shared_ptr<pbrt::LightSource> *)0x10f1e8);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<pbrt::LightSource>_*,_std::vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>_>
    ::operator++(&local_48);
  }
  bVar1 = bVar10;
  peVar3 = std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x10f225);
  sVar4 = std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
          ::size(&peVar3->shapes);
  Counter::add(in_RDI + 10,(bool)(bVar10 & 1),sVar4);
  peVar3 = std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x10f254);
  local_b8 = &peVar3->shapes;
  local_c0._M_current =
       (shared_ptr<pbrt::Shape> *)
       std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>::
       begin((vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_> *
             )in_stack_fffffffffffffdc8);
  local_c8 = (shared_ptr<pbrt::Shape> *)
             std::
             vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>::
             end((vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                  *)in_stack_fffffffffffffdc8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
                             *)in_stack_fffffffffffffdd0,
                            (__normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
                             *)in_stack_fffffffffffffdc8), bVar2) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
    ::operator*(&local_c0);
    std::shared_ptr<pbrt::Shape>::shared_ptr
              ((shared_ptr<pbrt::Shape> *)in_stack_fffffffffffffdd0,
               (shared_ptr<pbrt::Shape> *)in_stack_fffffffffffffdc8);
    std::__shared_ptr_access<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x10f2e7);
    pVar9 = std::
            set<std::shared_ptr<pbrt::Material>,_std::less<std::shared_ptr<pbrt::Material>_>,_std::allocator<std::shared_ptr<pbrt::Material>_>_>
            ::insert((set<std::shared_ptr<pbrt::Material>,_std::less<std::shared_ptr<pbrt::Material>_>,_std::allocator<std::shared_ptr<pbrt::Material>_>_>
                      *)in_stack_fffffffffffffdf0,(value_type *)in_stack_fffffffffffffde8);
    local_e8 = (_Base_ptr)pVar9.first._M_node;
    local_e0 = pVar9.second;
    peVar5 = std::__shared_ptr_access<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x10f328);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar5->areaLight);
    bVar10 = bVar1;
    if (bVar2) {
      Counter::add(in_RDI + 6,(bool)(bVar1 & 1),1);
      bVar10 = bVar1;
    }
    std::dynamic_pointer_cast<pbrt::TriangleMesh,pbrt::Shape>
              ((shared_ptr<pbrt::Shape> *)in_stack_fffffffffffffde8);
    bVar2 = std::__shared_ptr::operator_cast_to_bool(local_f8);
    if (bVar2) {
      bVar1 = bVar10;
      peVar6 = std::
               __shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x10f3ca);
      sVar4 = std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::size
                        (&peVar6->index);
      Counter::add(in_RDI + 1,(bool)(bVar10 & 1),sVar4);
    }
    else {
      std::dynamic_pointer_cast<pbrt::QuadMesh,pbrt::Shape>
                ((shared_ptr<pbrt::Shape> *)in_stack_fffffffffffffde8);
      bVar2 = std::__shared_ptr::operator_cast_to_bool(local_108);
      if (bVar2) {
        bVar1 = bVar10;
        peVar7 = std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x10f45f);
        sVar4 = std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::size
                          (&peVar7->index);
        Counter::add(in_RDI + 2,(bool)(bVar10 & 1),sVar4);
      }
      else {
        std::dynamic_pointer_cast<pbrt::Sphere,pbrt::Shape>
                  ((shared_ptr<pbrt::Shape> *)in_stack_fffffffffffffde8);
        bVar2 = std::__shared_ptr::operator_cast_to_bool(local_118);
        if (bVar2) {
          Counter::add(in_RDI + 3,(bool)(bVar10 & 1),1);
        }
        else {
          std::dynamic_pointer_cast<pbrt::Disk,pbrt::Shape>
                    ((shared_ptr<pbrt::Shape> *)in_stack_fffffffffffffde8);
          bVar2 = std::__shared_ptr::operator_cast_to_bool(local_128);
          if (bVar2) {
            Counter::add(in_RDI + 4,(bool)(bVar10 & 1),1);
          }
          else {
            std::dynamic_pointer_cast<pbrt::Curve,pbrt::Shape>
                      ((shared_ptr<pbrt::Shape> *)in_stack_fffffffffffffde8);
            bVar2 = std::__shared_ptr::operator_cast_to_bool(local_138);
            if (bVar2) {
              Counter::add(in_RDI + 8,(bool)(bVar10 & 1),1);
            }
            else {
              in_stack_fffffffffffffdf0 =
                   std::operator<<((ostream *)&std::cout,"un-handled geometry type : ");
              peVar5 = std::
                       __shared_ptr_access<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x10f604);
              (**(peVar5->super_Entity)._vptr_Entity)(local_158);
              in_stack_fffffffffffffde8 =
                   (Entity *)std::operator<<(in_stack_fffffffffffffdf0,local_158);
              std::ostream::operator<<
                        (in_stack_fffffffffffffde8,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string(local_158);
            }
            std::shared_ptr<pbrt::Curve>::~shared_ptr((shared_ptr<pbrt::Curve> *)0x10f684);
          }
          std::shared_ptr<pbrt::Disk>::~shared_ptr((shared_ptr<pbrt::Disk> *)0x10f6a2);
        }
        std::shared_ptr<pbrt::Sphere>::~shared_ptr((shared_ptr<pbrt::Sphere> *)0x10f6c0);
        bVar1 = bVar10;
      }
      std::shared_ptr<pbrt::QuadMesh>::~shared_ptr((shared_ptr<pbrt::QuadMesh> *)0x10f6de);
    }
    std::shared_ptr<pbrt::TriangleMesh>::~shared_ptr((shared_ptr<pbrt::TriangleMesh> *)0x10f6fc);
    std::shared_ptr<pbrt::Shape>::~shared_ptr((shared_ptr<pbrt::Shape> *)0x10f709);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
    ::operator++(&local_c0);
  }
  bVar10 = bVar1;
  peVar3 = std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x10f752);
  sVar4 = std::
          vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
          ::size(&peVar3->instances);
  Counter::add(in_RDI,(bool)(bVar1 & 1),sVar4);
  peVar3 = std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x10f784);
  local_160 = &peVar3->instances;
  local_168._M_current =
       (shared_ptr<pbrt::Instance> *)
       std::
       vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>::
       begin((vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
              *)in_stack_fffffffffffffdc8);
  local_170 = (shared_ptr<pbrt::Instance> *)
              std::
              vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
              ::end((vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
                     *)in_stack_fffffffffffffdc8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
                             *)in_stack_fffffffffffffdd0,
                            (__normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
                             *)in_stack_fffffffffffffdc8), bVar2) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
    ::operator*(&local_168);
    in_stack_fffffffffffffdd0 = &local_180;
    std::shared_ptr<pbrt::Instance>::shared_ptr
              (in_stack_fffffffffffffdd0,(shared_ptr<pbrt::Instance> *)in_stack_fffffffffffffdc8);
    std::__shared_ptr_access<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x10f804);
    std::shared_ptr<pbrt::Object>::shared_ptr
              ((shared_ptr<pbrt::Object> *)in_stack_fffffffffffffdd0,
               (shared_ptr<pbrt::Object> *)in_stack_fffffffffffffdc8);
    traverse(in_RSI,(SP *)CONCAT17(bVar10,in_stack_ffffffffffffffe8));
    std::shared_ptr<pbrt::Object>::~shared_ptr((shared_ptr<pbrt::Object> *)0x10f83e);
    std::shared_ptr<pbrt::Instance>::~shared_ptr((shared_ptr<pbrt::Instance> *)0x10f84b);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
    ::operator++(&local_168);
  }
  return;
}

Assistant:

void traverse(Object::SP object)
      {
        const bool firstTime = (alreadyTraversed.find(object) == alreadyTraversed.end());
        alreadyTraversed.insert(object);
 
        numObjects.add(firstTime,1);
        numLights.add(firstTime,object->lightSources.size());

        for (auto light : object->lightSources) {
          if (light->as<PointLightSource>())
            numPointLights.add(firstTime,1);
          if (light->as<SpotLightSource>())
            numSpotLights.add(firstTime,1);
          if (light->as<InfiniteLightSource>())
            numInfiniteLights.add(firstTime,1);
          if (light->as<DistantLightSource>())
            numDistantLights.add(firstTime,1);
        }
        
        numShapes.add(firstTime,object->shapes.size());
        
        for (auto shape : object->shapes) {
          usedMaterials.insert(shape->material);
          if (shape->areaLight) {
            numAreaLights.add(firstTime,1);
          }
          if (TriangleMesh::SP mesh=std::dynamic_pointer_cast<TriangleMesh>(shape)){
            numTriangles.add(firstTime,mesh->index.size());
          } else if (QuadMesh::SP mesh=std::dynamic_pointer_cast<QuadMesh>(shape)){
            numQuads.add(firstTime,mesh->index.size());
          } else if (Sphere::SP sphere=std::dynamic_pointer_cast<Sphere>(shape)){
            numSpheres.add(firstTime,1);
          } else if (Disk::SP disk=std::dynamic_pointer_cast<Disk>(shape)){
            numDisks.add(firstTime,1);
          } else if (Curve::SP curves=std::dynamic_pointer_cast<Curve>(shape)){
            numCurves.add(firstTime,1);
          } else
            std::cout << "un-handled geometry type : " << shape->toString() << std::endl;
        }

        numInstances.add(firstTime,object->instances.size());
        for (auto inst : object->instances) {
          traverse(inst->object);
        }
      }